

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O1

Node __thiscall Jzon::Node::get(Node *this,string *name)

{
  pointer pcVar1;
  undefined8 *puVar2;
  void *__s2;
  size_t sVar3;
  size_t __n;
  Data *pDVar4;
  int iVar5;
  undefined8 *in_RDX;
  undefined8 *puVar6;
  bool bVar7;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  if ((pcVar1 != (pointer)0x0) && (*(int *)(pcVar1 + 4) == 1)) {
    puVar6 = *(undefined8 **)(pcVar1 + 0x28);
    puVar2 = *(undefined8 **)(pcVar1 + 0x30);
    bVar7 = puVar6 == puVar2;
    if (!bVar7) {
      __s2 = (void *)*in_RDX;
      sVar3 = in_RDX[1];
      do {
        __n = puVar6[1];
        if ((__n == sVar3) && ((__n == 0 || (iVar5 = bcmp((void *)*puVar6,__s2,__n), iVar5 == 0))))
        {
          pDVar4 = (Data *)puVar6[4];
          this->data = pDVar4;
          if (pDVar4 != (Data *)0x0) {
            pDVar4->refCount = pDVar4->refCount + 1;
          }
          if (!bVar7) {
            return (Node)(Data *)this;
          }
          break;
        }
        puVar6 = puVar6 + 5;
        bVar7 = puVar6 == puVar2;
      } while (!bVar7);
    }
  }
  this->data = (Data *)0x0;
  return (Node)(Data *)this;
}

Assistant:

Node Node::get(const std::string &name) const
	{
		if (isObject())
		{
			NamedNodeList &children = data->children;
			for (NamedNodeList::const_iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					return (*it).second;
				}
			}
		}
		return Node(T_INVALID);
	}